

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

int lzham::lzham_lib_z_uncompress
              (uchar *pDest,lzham_z_ulong *pDest_len,uchar *pSource,lzham_z_ulong source_len)

{
  int iVar1;
  int iVar2;
  lzham_z_stream local_80;
  
  local_80.data_type = 0;
  local_80._92_4_ = 0;
  local_80.adler = 0;
  local_80.zfree = (lzham_z_free_func)0x0;
  local_80.opaque = (void *)0x0;
  local_80.state = (lzham_z_internal_state *)0x0;
  local_80.zalloc = (lzham_z_alloc_func)0x0;
  local_80.total_out = 0;
  local_80.msg = (char *)0x0;
  local_80.total_in = 0;
  local_80.reserved = 0;
  iVar1 = -10000;
  if ((*pDest_len | source_len) >> 0x20 == 0) {
    local_80._8_8_ = source_len & 0xffffffff;
    local_80._32_8_ = *pDest_len & 0xffffffff;
    local_80.next_in = pSource;
    local_80.next_out = pDest;
    iVar1 = lzham_lib_z_inflateInit(&local_80);
    if (iVar1 == 0) {
      iVar2 = lzham_lib_z_inflate(&local_80,4);
      if (iVar2 == 1) {
        *pDest_len = local_80.total_out;
        iVar1 = lzham_lib_z_inflateEnd(&local_80);
      }
      else {
        lzham_lib_z_inflateEnd(&local_80);
        iVar1 = -3;
        if (iVar2 != -5 || local_80.avail_in != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_uncompress(unsigned char *pDest, lzham_z_ulong *pDest_len, const unsigned char *pSource, lzham_z_ulong source_len)
   {
      lzham_z_stream stream;
      int status;
      memset(&stream, 0, sizeof(stream));

      // In case lzham_z_ulong is 64-bits (argh I hate longs).
      if ((source_len | *pDest_len) > 0xFFFFFFFFU) 
         return LZHAM_Z_PARAM_ERROR;

      stream.next_in = pSource;
      stream.avail_in = (uint)source_len;
      stream.next_out = pDest;
      stream.avail_out = (uint)*pDest_len;

      status = lzham_lib_z_inflateInit(&stream);
      if (status != LZHAM_Z_OK)
         return status;

      status = lzham_lib_z_inflate(&stream, LZHAM_Z_FINISH);
      if (status != LZHAM_Z_STREAM_END)
      {
         lzham_lib_z_inflateEnd(&stream);
         return ((status == LZHAM_Z_BUF_ERROR) && (!stream.avail_in)) ? LZHAM_Z_DATA_ERROR : status;
      }
      *pDest_len = stream.total_out;

      return lzham_lib_z_inflateEnd(&stream);
   }